

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test::TestBody
          (CoinSelection_SelectCoins_Simple_SelectCoinsBnB_single_Test *this)

{
  uint32_t vout;
  pointer pTVar1;
  bool bVar2;
  char *pcVar3;
  CoinSelectionOption *in_R9;
  string *output_descriptor;
  pointer utxo;
  Amount AVar4;
  bool use_bnb;
  Amount local_1a0;
  Txid txid;
  AssertionResult gtest_ar_;
  AssertHelper local_150;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  char *local_130;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Amount local_108;
  Amount fee_value;
  Amount select_value;
  Amount local_d8;
  CoinSelection coin_select;
  CoinSelectionOption option_params;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x93e0a40);
  local_d8.amount_ = AVar4.amount_;
  local_d8.ignore_check_ = AVar4.ignore_check_;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee_value);
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_108.amount_ = AVar4.amount_;
  local_108.ignore_check_ = AVar4.ignore_check_;
  use_bnb = false;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)kExtCoinSelectTestVector.
                          super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  pTVar1 = kExtCoinSelectTestVector.
           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_130 = "";
  utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
         super__Vector_impl_data._M_start;
  for (output_descriptor =
            &(kExtCoinSelectTestVector.
              super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
              super__Vector_impl_data._M_start)->descriptor;
      (pointer)&output_descriptor[-2].field_2 != pTVar1;
      output_descriptor = (string *)&output_descriptor[2].field_2) {
    cfd::core::Txid::Txid(&txid);
    if (*(long *)((long)&output_descriptor[-2].field_2 + 8) != 0) {
      cfd::core::Txid::Txid((Txid *)&gtest_ar_,(string *)&output_descriptor[-2].field_2);
      cfd::core::Txid::operator=(&txid,(Txid *)&gtest_ar_);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar_);
    }
    vout = *(uint32_t *)&output_descriptor[-1].field_2;
    AVar4 = cfd::core::Amount::CreateBySatoshiAmount
                      (*(int64_t *)((long)&output_descriptor[-1].field_2 + 8));
    local_1a0.amount_ = AVar4.amount_;
    local_1a0.ignore_check_ = AVar4.ignore_check_;
    std::__cxx11::string::string((string *)&gtest_ar_,"",(allocator *)&local_150);
    in_R9 = (CoinSelectionOption *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (&txid,vout,output_descriptor,&local_1a0,(string *)&gtest_ar_,(void *)0x0,utxo,
               (Script *)0x0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    utxo = utxo + 1;
    cfd::core::Txid::~Txid(&txid);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,2.0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      in_R9 = &option_params;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,&local_d8,
                 &utxos,&exp_filter,in_R9,&local_108,&select_value,&fee_value,&use_bnb);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&select_utxos,&txid);
      std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid);
    }
  }
  else {
    testing::Message::Message((Message *)&txid);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d8,
               "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&txid);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txid);
  }
  gtest_ar_._0_8_ =
       ((long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xd8;
  local_1a0.amount_ = CONCAT44(local_1a0.amount_._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&txid,"select_utxos.size()","1",(unsigned_long *)&gtest_ar_,
             (int *)&local_1a0);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      local_130 = *(char **)txid.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1d9,local_130);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_1a0.amount_ = 0x93e10e4;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&txid,"select_value.GetSatoshiValue()","static_cast<int64_t>(155062500)",
             (long *)&gtest_ar_,&local_1a0.amount_);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1da,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee_value);
  local_1a0.amount_ = 0xb8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&txid,"fee_value.GetSatoshiValue()","static_cast<int64_t>(184)",
             (long *)&gtest_ar_,&local_1a0.amount_);
  if ((char)txid._vptr_Txid == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1db,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txid.data_);
  if ((long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd8) {
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0x93e10;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&txid,"select_utxos[0].amount","static_cast<int64_t>(155062500)",
               &(select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start)->amount,(long *)&gtest_ar_);
    if ((char)txid._vptr_Txid == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x1dd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid.data_);
  }
  gtest_ar_.success_ = use_bnb;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb == false) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&txid,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","false","true",
               &in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x1df,(char *)CONCAT71(txid._vptr_Txid._1_7_,(char)txid._vptr_Txid));
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&txid);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option_params.fee_asset_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_SelectCoinsBnB_single)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(155060800);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(2);

  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)));
  EXPECT_EQ(select_utxos.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), static_cast<int64_t>(155062500));
  EXPECT_EQ(fee_value.GetSatoshiValue(), static_cast<int64_t>(184));
  if (select_utxos.size() == 1) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(155062500));
  }
  EXPECT_TRUE(use_bnb);
}